

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void double_conversion::FillDigits32(uint32_t number,Vector<char> buffer,int *length)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  int *in_RCX;
  uint uVar4;
  uint in_EDI;
  long in_FS_OFFSET;
  char tmp;
  int j;
  int i;
  int digit;
  int number_length;
  int local_38;
  int local_34;
  int local_2c;
  uint local_1c;
  Vector<char> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  local_1c = in_EDI;
  while (local_1c != 0) {
    uVar4 = local_1c % 10;
    local_1c = local_1c / 10;
    pcVar3 = Vector<char>::operator[](&local_18,*in_RCX + local_2c);
    *pcVar3 = (char)uVar4 + '0';
    local_2c = local_2c + 1;
  }
  local_38 = *in_RCX + local_2c;
  for (local_34 = *in_RCX; local_38 = local_38 + -1, local_34 < local_38; local_34 = local_34 + 1) {
    pcVar3 = Vector<char>::operator[](&local_18,local_34);
    cVar1 = *pcVar3;
    pcVar3 = Vector<char>::operator[](&local_18,local_38);
    cVar2 = *pcVar3;
    pcVar3 = Vector<char>::operator[](&local_18,local_34);
    *pcVar3 = cVar2;
    pcVar3 = Vector<char>::operator[](&local_18,local_38);
    *pcVar3 = cVar1;
  }
  *in_RCX = *in_RCX + local_2c;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void FillDigits32(uint32_t number, Vector<char> buffer, int* length) {
  int number_length = 0;
  // We fill the digits in reverse order and exchange them afterwards.
  while (number != 0) {
    int digit = number % 10;
    number /= 10;
    buffer[(*length) + number_length] = static_cast<char>('0' + digit);
    number_length++;
  }
  // Exchange the digits.
  int i = *length;
  int j = *length + number_length - 1;
  while (i < j) {
    char tmp = buffer[i];
    buffer[i] = buffer[j];
    buffer[j] = tmp;
    i++;
    j--;
  }
  *length += number_length;
}